

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

void proxy_free(proxy_handle *ph)

{
  void *pvVar1;
  proxy_priv *priv;
  
  pvVar1 = ph->priv;
  if (pvVar1 != (void *)0x0) {
    proxy_close(ph);
    mutex_free((mutex_handle *)((long)pvVar1 + 0x880));
    mutex_free((mutex_handle *)((long)pvVar1 + 0x878));
    mutex_free((mutex_handle *)((long)pvVar1 + 0x870));
    registration_service_free((registration_service_handle *)((long)pvVar1 + 0x888));
    conn_free((conn_handle *)((long)pvVar1 + 0x840));
    conf_free(&ph->conf);
    log_free((log_handle *)((long)pvVar1 + 0x860));
    if (*(regex_handle **)((long)pvVar1 + 0x828) != (regex_handle *)0x0) {
      regex_free(*(regex_handle **)((long)pvVar1 + 0x828));
      free(*(void **)((long)pvVar1 + 0x828));
    }
    if (*(regex_handle **)((long)pvVar1 + 0x830) != (regex_handle *)0x0) {
      regex_free(*(regex_handle **)((long)pvVar1 + 0x830));
      free(*(void **)((long)pvVar1 + 0x830));
    }
    rand_free();
    free(ph->priv);
    ph->priv = (void *)0x0;
  }
  return;
}

Assistant:

void proxy_free(struct proxy_handle *ph)
{
	if (ph->priv != NULL) {
		struct proxy_priv *priv = ph->priv;

		proxy_close(ph);

		/* Free idle_workers mutex */
		mutex_free(&priv->idle_workers_mutex);

		/* Free idle_clients mutex */
		mutex_free(&priv->idle_clients_mutex);

		/* Free usable_clients mutex */
		mutex_free(&priv->usable_clients_mutex);

		/* Free registration service */
		registration_service_free(&priv->reg_service);

		/* Free connections */
		conn_free(&priv->conn_listen);

		/* Free config */
		conf_free(&ph->conf);

		/* Free logger */
		log_free(&priv->log);

		if (priv->re_calls_allowed != NULL) {
			regex_free(priv->re_calls_allowed);
			free(priv->re_calls_allowed);
		}

		if (priv->re_calls_denied != NULL) {
			regex_free(priv->re_calls_denied);
			free(priv->re_calls_denied);
		}

		/* Free RNG */
		rand_free();

		free(ph->priv);
		ph->priv = NULL;
	}
}